

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_texture_border_clamp(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_texture_border_clamp != 0) {
    glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)(*load)("glTexParameterIivEXT");
    glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)(*load)("glTexParameterIuivEXT");
    glad_glGetTexParameterIivEXT =
         (PFNGLGETTEXPARAMETERIIVEXTPROC)(*load)("glGetTexParameterIivEXT");
    glad_glGetTexParameterIuivEXT =
         (PFNGLGETTEXPARAMETERIUIVEXTPROC)(*load)("glGetTexParameterIuivEXT");
    glad_glSamplerParameterIivEXT =
         (PFNGLSAMPLERPARAMETERIIVEXTPROC)(*load)("glSamplerParameterIivEXT");
    glad_glSamplerParameterIuivEXT =
         (PFNGLSAMPLERPARAMETERIUIVEXTPROC)(*load)("glSamplerParameterIuivEXT");
    glad_glGetSamplerParameterIivEXT =
         (PFNGLGETSAMPLERPARAMETERIIVEXTPROC)(*load)("glGetSamplerParameterIivEXT");
    glad_glGetSamplerParameterIuivEXT =
         (PFNGLGETSAMPLERPARAMETERIUIVEXTPROC)(*load)("glGetSamplerParameterIuivEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_texture_border_clamp(GLADloadproc load) {
	if(!GLAD_GL_EXT_texture_border_clamp) return;
	glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)load("glTexParameterIivEXT");
	glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)load("glTexParameterIuivEXT");
	glad_glGetTexParameterIivEXT = (PFNGLGETTEXPARAMETERIIVEXTPROC)load("glGetTexParameterIivEXT");
	glad_glGetTexParameterIuivEXT = (PFNGLGETTEXPARAMETERIUIVEXTPROC)load("glGetTexParameterIuivEXT");
	glad_glSamplerParameterIivEXT = (PFNGLSAMPLERPARAMETERIIVEXTPROC)load("glSamplerParameterIivEXT");
	glad_glSamplerParameterIuivEXT = (PFNGLSAMPLERPARAMETERIUIVEXTPROC)load("glSamplerParameterIuivEXT");
	glad_glGetSamplerParameterIivEXT = (PFNGLGETSAMPLERPARAMETERIIVEXTPROC)load("glGetSamplerParameterIivEXT");
	glad_glGetSamplerParameterIuivEXT = (PFNGLGETSAMPLERPARAMETERIUIVEXTPROC)load("glGetSamplerParameterIuivEXT");
}